

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Aig_Man_t *pAVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iData;
  uint uVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  undefined4 *puVar8;
  Aig_Obj_t *pObj_00;
  uint *puVar9;
  ulong uVar10;
  ushort *puVar11;
  long lVar12;
  int Lits [5];
  uint local_48 [6];
  
  uVar4 = Saig_ManBmcLiteral(p,pObj,iFrame);
  if (uVar4 == 0xffffffff) {
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x423,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar7 = uVar4 & 7;
    if (uVar7 == 3) {
      uVar4 = Saig_ManBmcCreateCnf_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      uVar4 = *(uint *)&pObj->pFanin0 & 1 ^ uVar4;
    }
    else if (uVar7 == 2) {
      pAVar1 = p->pAig;
      if ((pObj->field_0).CioId < pAVar1->nTruePis) {
        iVar5 = p->nSatVars;
        p->nSatVars = iVar5 + 1;
        uVar4 = iVar5 * 2;
      }
      else {
        uVar4 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
        if (((int)uVar4 < 0) || (pAVar1->vCos->nSize <= (int)uVar4)) {
LAB_0056eaf0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar4 = Saig_ManBmcCreateCnf_rec(p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar4],iFrame + -1);
      }
    }
    else {
      if ((uVar4 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                      ,0x433,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
      }
      iVar5 = pObj->Id;
      if ((long)iVar5 < 0) {
LAB_0056eb4d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = p->vMapping->nSize;
      if ((int)uVar4 <= iVar5) goto LAB_0056eb4d;
      piVar2 = p->vMapping->pArray;
      uVar7 = piVar2[iVar5];
      if ((ulong)uVar7 == 0) {
        puVar11 = (ushort *)0x0;
      }
      else {
        if (((int)uVar7 < 0) || (uVar4 <= uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        puVar11 = (ushort *)(piVar2 + uVar7);
      }
      lVar12 = 0;
      do {
        uVar4 = *(uint *)(puVar11 + lVar12 * 2 + 2);
        if ((ulong)uVar4 == 0xffffffff) {
          uVar4 = 0xffffffff;
        }
        else {
          pVVar3 = p->pAig->vObjs;
          if (pVVar3 == (Vec_Ptr_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            if (((int)uVar4 < 0) || (pVVar3->nSize <= (int)uVar4)) goto LAB_0056eaf0;
            pObj_00 = (Aig_Obj_t *)pVVar3->pArray[uVar4];
          }
          uVar4 = Saig_ManBmcCreateCnf_rec(p,pObj_00,iFrame);
        }
        local_48[lVar12] = uVar4;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      uVar4 = (uint)*puVar11;
      puVar9 = &Saig_ManBmcCof1_s_Truth;
      lVar12 = 0;
      do {
        if (local_48[lVar12] == 1) {
          uVar4 = uVar4 & *puVar9;
          uVar7 = uVar4 >> ((byte)(1 << ((byte)lVar12 & 0x1f)) & 0x1f);
LAB_0056e8f9:
          uVar4 = uVar7 & 0xffff | uVar4;
          local_48[lVar12] = 0xffffffff;
        }
        else if (local_48[lVar12] == 0) {
          uVar4 = uVar4 & ~*puVar9;
          uVar7 = uVar4 << ((byte)(1 << ((byte)lVar12 & 0x1f)) & 0x1f);
          goto LAB_0056e8f9;
        }
        lVar12 = lVar12 + 1;
        puVar9 = puVar9 + 1;
      } while (lVar12 != 4);
      puVar9 = &DAT_00a04540;
      puVar8 = &DAT_00a04534;
      uVar10 = 0;
      do {
        if (local_48[uVar10] == 0xffffffff) {
          if (uVar10 < 3) {
            bVar6 = (byte)*puVar8;
            uVar7 = *puVar9;
          }
          else {
            uVar7 = 0xff;
            bVar6 = 8;
          }
          if (((uVar4 >> (bVar6 & 0x1f) ^ uVar4) & uVar7) != 0) {
            __assert_fail("Saig_ManBmcCofEqual(uTruth, v)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x3d0,"int Saig_ManBmcReduceTruth(int, int *)");
          }
        }
        else {
          if (uVar10 < 3) {
            bVar6 = (byte)*puVar8;
            uVar7 = *puVar9;
          }
          else {
            uVar7 = 0xff;
            bVar6 = 8;
          }
          if (((uVar4 >> (bVar6 & 0x1f) ^ uVar4) & uVar7) == 0) {
            local_48[uVar10] = 0xffffffff;
          }
        }
        uVar10 = uVar10 + 1;
        puVar9 = puVar9 + 1;
        puVar8 = puVar8 + 1;
      } while (uVar10 != 4);
      if ((uVar4 == 0xffff) || (uVar4 == 0)) {
        uVar4 = (uint)(uVar4 == 0xffff);
      }
      else {
        uVar7 = Dar_CutSortVars(uVar4,(int *)local_48);
        if ((uVar7 == 0xffff) || (uVar7 == 0)) {
          __assert_fail("uTruth != 0 && uTruth != 0xffff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                        ,0x444,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        if ((uVar7 == 0xaaaa) || (uVar7 == 0x5555)) {
          if ((int)local_48[0] < 0) {
LAB_0056ebc9:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = local_48[0] ^ uVar7 == 0x5555;
          p->nBufNum = p->nBufNum + 1;
        }
        else {
          local_48[4] = ~uVar7 & 0xffff;
          if ((uVar7 & 1) == 0) {
            local_48[4] = uVar7;
          }
          iVar5 = p->vData->nSize;
          iData = iVar5 / 5;
          if (iData * 5 != iVar5) {
            __assert_fail("iEntry * 5 == Vec_IntSize(p->vData)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x450,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
          }
          lVar12 = 0;
          do {
            Vec_IntPush(p->vData,local_48[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 5);
          iVar5 = Hsh_IntManAdd(p->vHash,iData);
          if (iVar5 == iData) {
            iVar5 = p->nSatVars;
            p->nSatVars = iVar5 + 1;
            uVar4 = iVar5 * 2;
            Saig_ManBmcAddClauses(p,local_48[4],(int *)local_48,uVar4);
            if (iData != p->vId2Lit->nSize) {
              __assert_fail("iEntry == Vec_IntSize(p->vId2Lit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                            ,0x458,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)")
              ;
            }
            Vec_IntPush(p->vId2Lit,uVar4);
            p->nHashMiss = p->nHashMiss + 1;
          }
          else {
            uVar4 = Vec_IntEntry(p->vId2Lit,iVar5);
            piVar2 = &p->vData->nSize;
            *piVar2 = *piVar2 + -5;
            p->nHashHit = p->nHashHit + 1;
          }
          if ((int)uVar4 < 0) goto LAB_0056ebc9;
          uVar4 = uVar4 ^ uVar7 & 1;
        }
      }
    }
    Saig_ManBmcSetLiteral(p,pObj,iFrame,uVar4);
  }
  return uVar4;
}

Assistant:

int Saig_ManBmcCreateCnf_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    extern unsigned Dar_CutSortVars( unsigned uTruth, int * pVars );
    int * pMapping, i, iLit, Lits[5], uTruth;
    iLit = Saig_ManBmcLiteral( p, pObj, iFrame );
    if ( iLit != ~0 )
        return iLit; 
    assert( iFrame >= 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            iLit = toLit( p->nSatVars++ );
        else
            iLit = Saig_ManBmcCreateCnf_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame-1 );
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        iLit = Saig_ManBmcCreateCnf_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            iLit = lit_neg(iLit);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    assert( Aig_ObjIsNode(pObj) );
    pMapping = Saig_ManBmcMapping( p, pObj );
    for ( i = 0; i < 4; i++ )
        if ( pMapping[i+1] == -1 )
            Lits[i] = -1;
        else
            Lits[i] = Saig_ManBmcCreateCnf_rec( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame );
    uTruth = 0xffff & (unsigned)pMapping[0];
    // propagate constants
    uTruth = Saig_ManBmcReduceTruth( uTruth, Lits );
    if ( uTruth == 0 || uTruth == 0xffff )
    {
        iLit = (uTruth == 0xffff);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    // canonicize inputs
    uTruth = Dar_CutSortVars( uTruth, Lits );
    assert( uTruth != 0 && uTruth != 0xffff );
    if ( uTruth == 0xAAAA || uTruth == 0x5555 )
    {
        iLit = Abc_LitNotCond( Lits[0], uTruth == 0x5555 );
        p->nBufNum++;
    }
    else 
    {
        int iEntry, iRes;
        int fCompl = (uTruth & 1);
        Lits[4] = (uTruth & 1) ? 0xffff & ~uTruth : uTruth;
        iEntry = Vec_IntSize(p->vData) / 5;
        assert( iEntry * 5 == Vec_IntSize(p->vData) );
        for ( i = 0; i < 5; i++ )
            Vec_IntPush( p->vData, Lits[i] );
        iRes = Hsh_IntManAdd( p->vHash, iEntry );
        if ( iRes == iEntry )
        {
            iLit = toLit( p->nSatVars++ );
            Saig_ManBmcAddClauses( p, Lits[4], Lits, iLit );
            assert( iEntry == Vec_IntSize(p->vId2Lit) );
            Vec_IntPush( p->vId2Lit, iLit );
            p->nHashMiss++;
        }
        else
        {
            iLit = Vec_IntEntry( p->vId2Lit, iRes );
            Vec_IntShrink( p->vData, Vec_IntSize(p->vData) - 5 );
            p->nHashHit++;
        }
        iLit = Abc_LitNotCond( iLit, fCompl );
    }
    return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
}